

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void jsonArrayCompute(sqlite3_context *ctx,int isFinal)

{
  JsonString *p;
  void *pvVar1;
  code *xDel;
  int flags;
  JsonString *pStr;
  int isFinal_local;
  sqlite3_context *ctx_local;
  
  p = (JsonString *)sqlite3_aggregate_context(ctx,0);
  if (p == (JsonString *)0x0) {
    sqlite3_result_text(ctx,"[]",2,(_func_void_void_ptr *)0x0);
  }
  else {
    p->pCtx = ctx;
    jsonAppendChar(p,']');
    pvVar1 = sqlite3_user_data(ctx);
    if (p->eErr != '\0') {
      jsonReturnString(p,(JsonParse *)0x0,(sqlite3_context *)0x0);
      return;
    }
    if (((ulong)pvVar1 & 8) != 0) {
      jsonReturnStringAsBlob(p);
      if (isFinal == 0) {
        jsonStringTrimOneChar(p);
        return;
      }
      if (p->bStatic != '\0') {
        return;
      }
      sqlite3RCStrUnref(p->zBuf);
      return;
    }
    if (isFinal == 0) {
      sqlite3_result_text(ctx,p->zBuf,(int)p->nUsed,(_func_void_void_ptr *)0xffffffffffffffff);
      jsonStringTrimOneChar(p);
    }
    else {
      xDel = sqlite3RCStrUnref;
      if (p->bStatic != '\0') {
        xDel = (_func_void_void_ptr *)0xffffffffffffffff;
      }
      sqlite3_result_text(ctx,p->zBuf,(int)p->nUsed,xDel);
      p->bStatic = '\x01';
    }
  }
  sqlite3_result_subtype(ctx,0x4a);
  return;
}

Assistant:

static void jsonArrayCompute(sqlite3_context *ctx, int isFinal){
  JsonString *pStr;
  pStr = (JsonString*)sqlite3_aggregate_context(ctx, 0);
  if( pStr ){
    int flags;
    pStr->pCtx = ctx;
    jsonAppendChar(pStr, ']');
    flags = SQLITE_PTR_TO_INT(sqlite3_user_data(ctx));
    if( pStr->eErr ){
      jsonReturnString(pStr, 0, 0);
      return;
    }else if( flags & JSON_BLOB ){
      jsonReturnStringAsBlob(pStr);
      if( isFinal ){
        if( !pStr->bStatic ) sqlite3RCStrUnref(pStr->zBuf);
      }else{
        jsonStringTrimOneChar(pStr);
      }
      return;
    }else if( isFinal ){
      sqlite3_result_text(ctx, pStr->zBuf, (int)pStr->nUsed,
                          pStr->bStatic ? SQLITE_TRANSIENT :
                              sqlite3RCStrUnref);
      pStr->bStatic = 1;
    }else{
      sqlite3_result_text(ctx, pStr->zBuf, (int)pStr->nUsed, SQLITE_TRANSIENT);
      jsonStringTrimOneChar(pStr);
    }
  }else{
    sqlite3_result_text(ctx, "[]", 2, SQLITE_STATIC);
  }
  sqlite3_result_subtype(ctx, JSON_SUBTYPE);
}